

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParseExternalEntity(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlDocPtr val_00;
  xmlSAXHandlerPtr val_01;
  void *val_02;
  xmlChar *val_03;
  xmlChar *val_04;
  int local_7c;
  int n_list;
  xmlNodePtr *list;
  int n_ID;
  xmlChar *ID;
  int n_URL;
  xmlChar *URL;
  int n_depth;
  int depth;
  int n_user_data;
  void *user_data;
  int n_sax;
  xmlSAXHandlerPtr sax;
  int n_doc;
  xmlDocPtr doc;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (sax._4_4_ = 0; (int)sax._4_4_ < 4; sax._4_4_ = sax._4_4_ + 1) {
    for (user_data._4_4_ = 0; (int)user_data._4_4_ < 2; user_data._4_4_ = user_data._4_4_ + 1) {
      for (n_depth = 0; n_depth < 3; n_depth = n_depth + 1) {
        for (URL._4_4_ = 0; (int)URL._4_4_ < 4; URL._4_4_ = URL._4_4_ + 1) {
          for (ID._4_4_ = 0; (int)ID._4_4_ < 5; ID._4_4_ = ID._4_4_ + 1) {
            for (list._4_4_ = 0; (int)list._4_4_ < 5; list._4_4_ = list._4_4_ + 1) {
              for (local_7c = 0; local_7c < 1; local_7c = local_7c + 1) {
                iVar1 = xmlMemBlocks();
                val_00 = gen_xmlDocPtr(sax._4_4_,0);
                val_01 = gen_xmlSAXHandlerPtr(user_data._4_4_,1);
                val_02 = gen_userdata(n_depth,2);
                iVar2 = gen_int(URL._4_4_,3);
                val_03 = gen_const_xmlChar_ptr(ID._4_4_,4);
                val_04 = gen_const_xmlChar_ptr(list._4_4_,5);
                val = xmlParseExternalEntity(val_00,val_01,val_02,iVar2,val_03,val_04,0);
                desret_int(val);
                call_tests = call_tests + 1;
                des_xmlDocPtr(sax._4_4_,val_00,0);
                des_xmlSAXHandlerPtr(user_data._4_4_,val_01,1);
                des_userdata(n_depth,val_02,2);
                des_int(URL._4_4_,iVar2,3);
                des_const_xmlChar_ptr(ID._4_4_,val_03,4);
                des_const_xmlChar_ptr(list._4_4_,val_04,5);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlParseExternalEntity",
                         (ulong)(uint)(iVar2 - iVar1));
                  ret_val = ret_val + 1;
                  printf(" %d",(ulong)sax._4_4_);
                  printf(" %d",(ulong)user_data._4_4_);
                  printf(" %d",(ulong)(uint)n_depth);
                  printf(" %d",(ulong)URL._4_4_);
                  printf(" %d",(ulong)ID._4_4_);
                  printf(" %d",(ulong)list._4_4_);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlParseExternalEntity(void) {
    int test_ret = 0;

#if defined(LIBXML_SAX1_ENABLED)
#ifdef LIBXML_SAX1_ENABLED
    int mem_base;
    int ret_val;
    xmlDocPtr doc; /* the document the chunk pertains to */
    int n_doc;
    xmlSAXHandlerPtr sax; /* the SAX handler block (possibly NULL) */
    int n_sax;
    void * user_data; /* The user data returned on SAX callbacks (possibly NULL) */
    int n_user_data;
    int depth; /* Used for loop detection, use 0 */
    int n_depth;
    const xmlChar * URL; /* the URL for the entity to load */
    int n_URL;
    const xmlChar * ID; /* the System ID for the entity to load */
    int n_ID;
    xmlNodePtr * list; /* the return value for the set of parsed nodes */
    int n_list;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_sax = 0;n_sax < gen_nb_xmlSAXHandlerPtr;n_sax++) {
    for (n_user_data = 0;n_user_data < gen_nb_userdata;n_user_data++) {
    for (n_depth = 0;n_depth < gen_nb_int;n_depth++) {
    for (n_URL = 0;n_URL < gen_nb_const_xmlChar_ptr;n_URL++) {
    for (n_ID = 0;n_ID < gen_nb_const_xmlChar_ptr;n_ID++) {
    for (n_list = 0;n_list < gen_nb_xmlNodePtr_ptr;n_list++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        sax = gen_xmlSAXHandlerPtr(n_sax, 1);
        user_data = gen_userdata(n_user_data, 2);
        depth = gen_int(n_depth, 3);
        URL = gen_const_xmlChar_ptr(n_URL, 4);
        ID = gen_const_xmlChar_ptr(n_ID, 5);
        list = gen_xmlNodePtr_ptr(n_list, 6);

        ret_val = xmlParseExternalEntity(doc, sax, user_data, depth, URL, ID, list);
        desret_int(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_xmlSAXHandlerPtr(n_sax, sax, 1);
        des_userdata(n_user_data, user_data, 2);
        des_int(n_depth, depth, 3);
        des_const_xmlChar_ptr(n_URL, URL, 4);
        des_const_xmlChar_ptr(n_ID, ID, 5);
        des_xmlNodePtr_ptr(n_list, list, 6);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParseExternalEntity",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_sax);
            printf(" %d", n_user_data);
            printf(" %d", n_depth);
            printf(" %d", n_URL);
            printf(" %d", n_ID);
            printf(" %d", n_list);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif
#endif

    return(test_ret);
}